

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::BinaryAggregateHeap<long,_int,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<long,_int,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          long *key,int *value)

{
  int iVar1;
  long lVar2;
  idx_t iVar3;
  long lVar4;
  ulong __holeIndex;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<int>_> *__first;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<int>_> __value;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<int>_> __value_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<int>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<int>_>_&)>
  __cmp;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<int>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<int>_>_&)>
  local_20;
  
  __first = this->heap;
  __holeIndex = this->size;
  if (__holeIndex < this->capacity) {
    __first[__holeIndex].first.value = *key;
    __first[__holeIndex].second.value = *value;
    this->size = __holeIndex + 1;
    lVar4 = __first[__holeIndex].first.value;
    iVar1 = __first[__holeIndex].second.value;
  }
  else {
    lVar4 = (__first->first).value;
    if (*key <= lVar4) {
      return;
    }
    if (1 < (long)__holeIndex) {
      lVar2 = __first[__holeIndex - 1].first.value;
      iVar1 = __first[__holeIndex - 1].second.value;
      __first[__holeIndex - 1].first.value = lVar4;
      __first[__holeIndex - 1].second.value = (__first->second).value;
      __value.second.value = iVar1;
      __value.first.value = lVar2;
      __value._12_4_ = 0;
      std::
      __adjust_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<int>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<int>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<int>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<int>>const&)>>
                (__first,0,(long)(__holeIndex * 0x10 + -0x10) >> 4,__value,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<int>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<int>_>_&)>
                  )Compare);
    }
    __first = this->heap;
    iVar3 = this->size;
    __first[iVar3 - 1].first.value = *key;
    __first[iVar3 - 1].second.value = *value;
    lVar4 = __first[iVar3 - 1].first.value;
    iVar1 = __first[iVar3 - 1].second.value;
    __holeIndex = ((long)(iVar3 * 0x10) >> 4) - 1;
  }
  local_20._M_comp = Compare;
  __value_00.second.value = iVar1;
  __value_00.first.value = lVar4;
  __value_00._12_4_ = 0;
  std::
  __push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<int>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<int>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<int>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<int>>const&)>>
            (__first,__holeIndex,0,__value_00,&local_20);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}